

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChPlasticityReissner::ComputeStiffnessMatrixElastoplastic
          (ChPlasticityReissner *this,ChMatrixRef *K,ChVector<double> *eps_u,ChVector<double> *eps_v
          ,ChVector<double> *kur_u,ChVector<double> *kur_v,ChShellReissnerInternalData *data,
          double z_inf,double z_sup,double angle)

{
  int iVar1;
  Scalar *pSVar2;
  long row;
  ChVector<double> m_v;
  ChVector<double> m_u;
  ChVector<double> n_v;
  double invdelta;
  ChVector<double> n_u;
  ChVectorN<double,_12> stress_1;
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  b_plastic_data;
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  a_plastic_data;
  ChVectorN<double,_12> stress_0;
  ChVectorN<double,_12> stress_d;
  ChVectorN<double,_12> strain_0;
  ChVector<double> dkur_u;
  ChVector<double> deps_v;
  ChVector<double> deps_u;
  ChVector<double> dkur_v;
  double local_390 [4];
  double local_370 [4];
  double local_350 [4];
  ChPlasticityReissner *local_330;
  double local_328 [5];
  VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> local_300 [2];
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  local_290;
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  local_270;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
  local_258;
  Matrix<double,_12,_1,_0,_12,_1> local_220;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *local_1b8;
  Matrix<double,_12,_1,_0,_12,_1> *local_1b0;
  Matrix<double,_12,_1,_0,_12,_1> local_1a0;
  Matrix<double,_12,_1,_0,_12,_1> local_140;
  ChVector<double> local_e0;
  ChVector<double> local_c8;
  ChVector<double> local_b0;
  ChVector<double> local_98;
  PointerType local_80;
  long lStack_78;
  long local_70;
  long local_68;
  
  local_328[3] = 0.0;
  local_350[2] = 0.0;
  local_370[2] = 0.0;
  local_390[2] = 0.0;
  local_328[1] = 0.0;
  local_328[2] = 0.0;
  local_350[0] = 0.0;
  local_350[1] = 0.0;
  local_370[0] = 0.0;
  local_370[1] = 0.0;
  local_390[0] = 0.0;
  local_390[1] = 0.0;
  local_270.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_270.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_ChPlasticityReissner[4])(this,1);
  local_290.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_ChPlasticityReissner[4])(this,1);
  iVar1 = (*this->_vptr_ChPlasticityReissner[2])
                    (z_inf,z_sup,angle,this,local_328 + 1,local_350,local_370,local_390,
                     ((local_270.
                       super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_chrono::fea::ChShellReissnerInternalData_*,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                     .super__Head_base<0UL,_chrono::fea::ChShellReissnerInternalData_*,_false>.
                     _M_head_impl,eps_u,eps_v,kur_u,kur_v,data);
  if ((char)iVar1 == '\0') {
    std::__shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2> *)
               &local_140,
               &(this->section->elasticity).
                super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>);
    local_80 = (K->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
    lStack_78 = (K->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
    local_70 = (K->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value;
    local_68 = (K->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
    (*(*(_func_int ***)
        local_140.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
        array[0])[3])(z_inf,z_sup,angle,
                      local_140.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
                      m_storage.m_data.array[0],&local_80,eps_u,eps_v,kur_u,kur_v);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (local_140.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                m_data.array + 1));
  }
  else {
    local_300[0].super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         eps_u->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_220,&local_140,0,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_220,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_300
              );
    local_300[0].super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         eps_v->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_220,&local_140,3,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_220,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_300
              );
    local_300[0].super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         kur_u->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_220,&local_140,6,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_220,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_300
              );
    local_300[0].super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         kur_v->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_220,&local_140,9,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_220,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_300
              );
    local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
    [0] = (double)(local_328 + 1);
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (local_300,&local_220,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_300[0].super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1a0);
    local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
    [0] = (double)local_350;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (local_300,&local_220,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_300[0].super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1a0);
    local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
    [0] = (double)local_370;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (local_300,&local_220,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_300[0].super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1a0);
    local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
    [0] = (double)local_390;
    local_330 = this;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (local_300,&local_220,9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_300,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1a0);
    local_328[0] = 1000000.0;
    for (row = 0; row != 0xc; row = row + 1) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)&local_140,
                          row,0);
      *pSVar2 = *pSVar2 + 1e-06;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (local_300,&local_140,0,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_b0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_300,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (local_300,&local_140,3,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_c8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_300,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (local_300,&local_140,6,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_e0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_300,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (local_300,&local_140,9,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_98,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_300,(type *)0x0);
      (*local_330->_vptr_ChPlasticityReissner[2])
                (z_inf,z_sup,angle,local_330,local_328 + 1,local_350,local_370,local_390,
                 ((local_290.
                   super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::fea::ChShellReissnerInternalData_*,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                 .super__Head_base<0UL,_chrono::fea::ChShellReissnerInternalData_*,_false>.
                 _M_head_impl,&local_b0,&local_c8,&local_e0,&local_98,data);
      local_258._0_8_ = local_328 + 1;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_1a0,
                 (Matrix<double,_12,_1,_0,_12,_1> *)local_300,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_1a0,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_258);
      local_258._0_8_ = local_350;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_1a0,
                 (Matrix<double,_12,_1,_0,_12,_1> *)local_300,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_1a0,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_258);
      local_258._0_8_ = local_370;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_1a0,
                 (Matrix<double,_12,_1,_0,_12,_1> *)local_300,6,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_1a0,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_258);
      local_258._0_8_ = local_390;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_1a0,
                 (Matrix<double,_12,_1,_0,_12,_1> *)local_300,9,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_1a0,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_258);
      local_1b0 = &local_220;
      local_1b8 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *
                  )local_300;
      Eigen::operator*(&local_258,local_328,(StorageBaseType *)&local_1b8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,12,1,0,12,1>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_1a0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>_>
                  *)&local_258);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
               *)&local_258,K,0,row,0xc,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Matrix<double,12,1,0,12,1>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                  *)&local_258,&local_1a0);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)&local_140,
                          row,0);
      *pSVar2 = *pSVar2 + -1e-06;
    }
  }
  std::
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ::~vector(&local_290);
  std::
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ::~vector(&local_270);
  return;
}

Assistant:

void ChPlasticityReissner::ComputeStiffnessMatrixElastoplastic(
							ChMatrixRef K,        ///< 12x12 material elastoplastic stiffness matrix values here
							const ChVector<>& eps_u,  ///< strains along \e u direction
							const ChVector<>& eps_v,  ///< strains along \e v direction
							const ChVector<>& kur_u,  ///< curvature along \e u direction
							const ChVector<>& kur_v,  ///< curvature along \e v direction
							const ChShellReissnerInternalData& data,  ///< updated material internal variables, at this point including {p_strain_e, p_strain_k, p_strain_acc}
							const double z_inf,       ///< layer lower z value (along thickness coord)
							const double z_sup,       ///< layer upper z value (along thickness coord)
							const double angle        ///< layer angle respect to x (if needed) 
) {
    ChVector<> n_u;
	ChVector<> n_v;
    ChVector<> m_u;
    ChVector<> m_v;

    std::vector<std::unique_ptr<ChShellReissnerInternalData>> a_plastic_data;
    this->CreatePlasticityData(1, a_plastic_data);
    std::vector<std::unique_ptr<ChShellReissnerInternalData>> b_plastic_data;
    this->CreatePlasticityData(1, b_plastic_data);

	bool in_plastic = ComputeStressWithReturnMapping(n_u, n_v, m_u, m_v,          
		*a_plastic_data[0], eps_u, eps_v, kur_u, kur_v, data, z_inf, z_sup,  angle        
	);


    if (!in_plastic) {

        // if no return mapping is needed at this strain state, just use elastic matrix:
        
		return this->section->GetElasticity()->ComputeStiffnessMatrix(K,eps_u, eps_v, kur_u, kur_v, z_inf, z_sup,  angle);

    } else {
		
		// if return mapping is needed at this strain state, compute the elastoplastic stiffness by brute force BDF

		ChVectorN<double, 12> strain_0;
		strain_0.segment(0, 3) = eps_u.eigen();
		strain_0.segment(3, 3) = eps_v.eigen();
		strain_0.segment(6, 3) = kur_u.eigen();
		strain_0.segment(9, 3) = kur_v.eigen();

		ChVectorN<double, 12> stress_0;
		stress_0.segment(0,3) = n_u.eigen();
		stress_0.segment(3,3) = n_v.eigen();
		stress_0.segment(6,3) = m_u.eigen();
		stress_0.segment(9,3) = m_v.eigen();

		double delta = 1e-6;
		double invdelta = 1.0 / delta;
		for (int i = 0; i < 12; ++i) {
			strain_0(i, 0) += delta;
			ChVector<> deps_u(strain_0.segment(0, 3));
			ChVector<> deps_v(strain_0.segment(3, 3));
			ChVector<> dkur_u(strain_0.segment(6, 3));
			ChVector<> dkur_v(strain_0.segment(9, 3));
			this->ComputeStressWithReturnMapping(n_u, n_v, m_u, m_v, *b_plastic_data[0], deps_u, deps_v, dkur_u, dkur_v, data, z_inf, z_sup, angle);
			ChVectorN<double, 12> stress_1;
			stress_1.segment(0,3) = n_u.eigen();
			stress_1.segment(3,3) = n_v.eigen();
			stress_1.segment(6,3) = m_u.eigen();
			stress_1.segment(9,3) = m_v.eigen();
			ChVectorN<double, 12> stress_d = invdelta * (stress_1 - stress_0);
			K.block(0, i, 12, 1) = stress_d;
			strain_0(i, 0) -= delta;
		}

     
    }
}